

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Performance::anon_unknown_1::
RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>::deinit
          (RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration> *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  RenderPerformanceTestBase::deinit(&this->super_RenderPerformanceTestBase);
  if (this->m_attributeBufferID != 0) {
    iVar1 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x438))(1,&this->m_attributeBufferID);
    this->m_attributeBufferID = 0;
  }
  if (this->m_indexBufferID != 0) {
    iVar1 = (*((this->super_RenderPerformanceTestBase).super_TestCase.m_context)->m_renderCtx->
              _vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x438))(1,&this->m_indexBufferID);
    this->m_indexBufferID = 0;
  }
  return;
}

Assistant:

void RenderCase<SampleType>::deinit (void)
{
	RenderPerformanceTestBase::deinit();

	if (m_attributeBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_attributeBufferID);
		m_attributeBufferID = 0;
	}

	if (m_indexBufferID)
	{
		m_context.getRenderContext().getFunctions().deleteBuffers(1, &m_indexBufferID);
		m_indexBufferID = 0;
	}
}